

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool __thiscall
mkvmuxer::Segment::AddMetadata
          (Segment *this,uint8_t *data,uint64_t length,uint64_t track_number,uint64_t timestamp_ns,
          uint64_t duration_ns)

{
  bool bVar1;
  Frame frame;
  Frame local_98;
  
  if (data == (uint8_t *)0x0) {
    bVar1 = false;
  }
  else {
    Frame::Frame(&local_98);
    bVar1 = Frame::Init(&local_98,data,length);
    if (bVar1) {
      local_98.duration_set_ = true;
      local_98.is_key_ = true;
      local_98.duration_ = duration_ns;
      local_98.track_number_ = track_number;
      local_98.timestamp_ = timestamp_ns;
      bVar1 = AddGenericFrame(this,&local_98);
    }
    else {
      bVar1 = false;
    }
    Frame::~Frame(&local_98);
  }
  return bVar1;
}

Assistant:

bool Segment::AddMetadata(const uint8_t* data, uint64_t length,
                          uint64_t track_number, uint64_t timestamp_ns,
                          uint64_t duration_ns) {
  if (!data)
    return false;

  Frame frame;
  if (!frame.Init(data, length))
    return false;
  frame.set_track_number(track_number);
  frame.set_timestamp(timestamp_ns);
  frame.set_duration(duration_ns);
  frame.set_is_key(true);  // All metadata blocks are keyframes.
  return AddGenericFrame(&frame);
}